

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O3

void helper_sve_cpy_m_s_aarch64(void *vd,void *vn,void *vg,uint64_t mm,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    uVar1 = *(ulong *)((long)vn + uVar2 * 8);
    *(uint64_t *)((long)vd + uVar2 * 8) =
         ((mm << 0x20 | mm & 0xffffffff) ^ uVar1) &
         *(ulong *)(expand_pred_s_word + (ulong)(*(byte *)((long)vg + uVar2) & 0x11) * 8) ^ uVar1;
    uVar2 = uVar2 + 1;
  } while ((desc & 0x1f) * 8 + 8 >> 3 != uVar2);
  return;
}

Assistant:

void HELPER(sve_cpy_m_s)(void *vd, void *vn, void *vg,
                         uint64_t mm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc) / 8;
    uint64_t *d = vd, *n = vn;
    uint8_t *pg = vg;

    mm = dup_const(MO_32, mm);
    for (i = 0; i < opr_sz; i += 1) {
        uint64_t nn = n[i];
        uint64_t pp = expand_pred_s(pg[H1(i)]);
        d[i] = (mm & pp) | (nn & ~pp);
    }
}